

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  ImGuiContext *pIVar1;
  ImGuiPopupData *pIVar2;
  uint in_ESI;
  ImGuiID in_EDI;
  int n;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  bool local_1;
  
  pIVar1 = GImGui;
  if ((in_ESI & 0x80) == 0) {
    if ((in_ESI & 0x100) == 0) {
      local_1 = false;
      if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)
                            (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                            0xffffffff00ffffff),in_stack_ffffffffffffffdc);
        local_1 = pIVar2->PopupId == in_EDI;
      }
    }
    else {
      for (iVar3 = 0; iVar3 < (pIVar1->OpenPopupStack).Size; iVar3 = iVar3 + 1) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
        if (pIVar2->PopupId == in_EDI) {
          return true;
        }
      }
      local_1 = false;
    }
  }
  else {
    if (in_EDI != 0) {
      __assert_fail("id == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1f22,"bool ImGui::IsPopupOpen(ImGuiID, ImGuiPopupFlags)");
    }
    if ((in_ESI & 0x100) == 0) {
      local_1 = (GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size;
    }
    else {
      local_1 = 0 < (GImGui->OpenPopupStack).Size;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}